

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O3

void __thiscall DiskTableNode::removeFromDisk(DiskTableNode *this)

{
  SSTable *this_00;
  _Rb_tree<long_long,_std::pair<const_long_long,_unsigned_long>,_std::_Select1st<std::pair<const_long_long,_unsigned_long>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
  *this_01;
  
  SSTable::removeFromDisk(this->_sstable);
  this_00 = this->_sstable;
  if (this_00 != (SSTable *)0x0) {
    SSTable::~SSTable(this_00);
  }
  operator_delete(this_00,0x40);
  this_01 = &this->index->_M_t;
  if (this_01 !=
      (_Rb_tree<long_long,_std::pair<const_long_long,_unsigned_long>,_std::_Select1st<std::pair<const_long_long,_unsigned_long>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
       *)0x0) {
    std::
    _Rb_tree<long_long,_std::pair<const_long_long,_unsigned_long>,_std::_Select1st<std::pair<const_long_long,_unsigned_long>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
    ::~_Rb_tree(this_01);
  }
  operator_delete(this_01,0x30);
  if (this->filter != (Filter *)0x0) {
    (*this->filter->_vptr_BloomFilter[1])();
  }
  this->_sstable = (SSTable *)0x0;
  this->filter = (Filter *)0x0;
  this->index = (IndexMap *)0x0;
  return;
}

Assistant:

void DiskTableNode::removeFromDisk() {
    _sstable->removeFromDisk();
    delete _sstable;
    delete index;
    delete filter;
    _sstable = nullptr;
    index = nullptr;
    filter = nullptr;
}